

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  xmlChar *pxVar8;
  byte *str;
  int iVar9;
  uint uVar10;
  int iVar11;
  int l;
  uint local_50;
  int local_4c;
  byte *local_48;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  local_48 = (byte *)0x0;
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '\"') {
    local_50 = 0x22;
  }
  else {
    if (xVar1 != '\'') {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    local_50 = 0x27;
  }
  pbVar6 = (byte *)(*xmlMallocAtomic)(100);
  if (pbVar6 == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  if (((ctxt->progressive != 0) || (0xf9 < (long)local_40->end - (long)local_40->cur)) ||
     (xmlGROW(ctxt), str = pbVar6, ctxt->instate != XML_PARSER_EOF)) {
    local_38 = orig;
    xmlNextChar(ctxt);
    iVar9 = 0;
    iVar11 = 100;
    do {
      uVar4 = xmlCurrentChar(ctxt,&local_4c);
      str = pbVar6;
      do {
        uVar10 = uVar4;
        if ((int)uVar4 < 0x100) {
          if ((0x1f < (int)uVar4) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0))))
          goto LAB_0015c560;
LAB_0015c69c:
          str[iVar9] = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015c739;
          if (uVar10 == local_50) {
            xmlNextChar(ctxt);
            local_48 = str;
            goto LAB_0015c6d1;
          }
          pxVar8 = (xmlChar *)0x0;
          xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
          goto LAB_0015c77f;
        }
        if (0xfffff < uVar4 - 0x10000 && (0x1ffd < uVar4 - 0xe000 && 0xd7ff < uVar4))
        goto LAB_0015c69c;
LAB_0015c560:
        if (((uVar4 == local_50) && (uVar10 = local_50, ctxt->input == local_40)) ||
           (uVar10 = uVar4, ctxt->instate == XML_PARSER_EOF)) goto LAB_0015c69c;
        pbVar6 = str;
        if (iVar11 <= iVar9 + 5) {
          iVar11 = iVar11 * 2;
          pbVar6 = (byte *)(*xmlRealloc)(str,(long)iVar11);
          if (pbVar6 == (byte *)0x0) {
            pxVar8 = (xmlChar *)0x0;
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_0015c77a;
          }
        }
        if (local_4c == 1) {
          lVar7 = (long)iVar9;
          iVar9 = iVar9 + 1;
          pbVar6[lVar7] = (byte)uVar4;
        }
        else {
          iVar5 = xmlCopyCharMultiByte(pbVar6 + iVar9,uVar4);
          iVar9 = iVar5 + iVar9;
        }
        pxVar3 = ctxt->input;
        if (*pxVar3->cur == '\n') {
          pxVar3->line = pxVar3->line + 1;
          pxVar3->col = 1;
        }
        else {
          pxVar3->col = pxVar3->col + 1;
        }
        pxVar8 = pxVar3->cur + local_4c;
        pxVar3->cur = pxVar8;
        if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar8 < 0xfa)) {
          xmlGROW(ctxt);
        }
        uVar4 = xmlCurrentChar(ctxt,&local_4c);
        str = pbVar6;
      } while (uVar4 != 0);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    } while( true );
  }
LAB_0015c739:
  pxVar8 = (xmlChar *)0x0;
  goto LAB_0015c77f;
LAB_0015c6d1:
  bVar2 = *local_48;
  uVar4 = (uint)bVar2;
  if (bVar2 == 0x25) {
LAB_0015c6f2:
    local_48 = local_48 + 1;
    pxVar8 = xmlParseStringName(ctxt,&local_48);
    if ((pxVar8 == (xmlChar *)0x0) || ((*xmlFree)(pxVar8), *local_48 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar4);
      pxVar8 = (xmlChar *)0x0;
      goto LAB_0015c77a;
    }
    if (((uVar4 == 0x25) && (ctxt->inSubset == 1)) && (ctxt->inputNr == 1)) {
      pxVar8 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
      goto LAB_0015c77a;
    }
  }
  else if (bVar2 == 0x26) {
    if (local_48[1] != 0x23) goto LAB_0015c6f2;
  }
  else if (uVar4 == 0) goto LAB_0015c79d;
  local_48 = local_48 + 1;
  goto LAB_0015c6d1;
LAB_0015c79d:
  ctxt->depth = ctxt->depth + 1;
  pxVar8 = xmlStringDecodeEntities(ctxt,str,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = str;
    return pxVar8;
  }
LAB_0015c77a:
  if (str == (byte *)0x0) {
    return pxVar8;
  }
LAB_0015c77f:
  (*xmlFree)(str);
  return pxVar8;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}